

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbistbl.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::RBBISymbolTable::lookup(RBBISymbolTable *this,UnicodeString *s)

{
  int *piVar1;
  void *pvVar2;
  RBBISymbolTable *This;
  UnicodeString *retString;
  RBBINode *usetNode;
  RBBINode *exprNode;
  RBBINode *varRefNode;
  RBBISymbolTableEntry *el;
  UnicodeString *s_local;
  RBBISymbolTable *this_local;
  
  pvVar2 = uhash_get_63(this->fHashTable,s);
  if (pvVar2 == (void *)0x0) {
    this_local = (RBBISymbolTable *)0x0;
  }
  else {
    piVar1 = *(int **)(*(long *)((long)pvVar2 + 0x48) + 0x10);
    if (*piVar1 == 0) {
      this->fCachedSetLookup = *(UnicodeSet **)(*(long *)(piVar1 + 4) + 0x20);
      This = (RBBISymbolTable *)&this->ffffString;
    }
    else {
      This = (RBBISymbolTable *)(piVar1 + 0xc);
      this->fCachedSetLookup = (UnicodeSet *)0x0;
    }
    this_local = This;
  }
  return (UnicodeString *)this_local;
}

Assistant:

const UnicodeString  *RBBISymbolTable::lookup(const UnicodeString& s) const
{
    RBBISymbolTableEntry  *el;
    RBBINode              *varRefNode;
    RBBINode              *exprNode;
    RBBINode              *usetNode;
    const UnicodeString   *retString;
    RBBISymbolTable       *This = (RBBISymbolTable *)this;   // cast off const

    el = (RBBISymbolTableEntry *)uhash_get(fHashTable, &s);
    if (el == NULL) {
        return NULL;
    }

    varRefNode = el->val;
    exprNode   = varRefNode->fLeftChild;     // Root node of expression for variable
    if (exprNode->fType == RBBINode::setRef) {
        // The $variable refers to a single UnicodeSet
        //   return the ffffString, which will subsequently be interpreted as a
        //   stand-in character for the set by RBBISymbolTable::lookupMatcher()
        usetNode = exprNode->fLeftChild;
        This->fCachedSetLookup = usetNode->fInputSet;
        retString = &ffffString;
    }
    else
    {
        // The variable refers to something other than just a set.
        // return the original source string for the expression
        retString = &exprNode->fText;
        This->fCachedSetLookup = NULL;
    }
    return retString;
}